

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ExplicitImportSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ExplicitImportSymbol,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2)

{
  string_view importName;
  string_view packageName;
  ExplicitImportSymbol *pEVar1;
  char *in_RCX;
  size_t in_RDX;
  SourceLocation *in_RSI;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  
  pEVar1 = (ExplicitImportSymbol *)
           allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  packageName._M_str = (char *)in_RSI;
  packageName._M_len = in_RDX;
  importName._M_str = in_RCX;
  importName._M_len = (size_t)in_RSI[1];
  ast::ExplicitImportSymbol::ExplicitImportSymbol
            (*(ExplicitImportSymbol **)(in_RDX + 8),packageName,importName,*in_RSI);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }